

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Orphan<capnp::compiler::Declaration::AnnotationApplication> *
kj::_::
CopyConstructArray_<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_*,_true,_false>
::apply(Orphan<capnp::compiler::Declaration::AnnotationApplication> *pos,
       Orphan<capnp::compiler::Declaration::AnnotationApplication> *start,
       Orphan<capnp::compiler::Declaration::AnnotationApplication> *end)

{
  ExceptionGuard local_28;
  
  for (; start != end;
      start = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)(&start->builder + 1))
  {
    capnp::_::OrphanBuilder::OrphanBuilder(&pos->builder,&start->builder);
    pos = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)(&pos->builder + 1);
  }
  local_28.start = pos;
  local_28.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)&pos->builder;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }